

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_internal.h
# Opt level: O2

bool __thiscall
bssl::InplaceVector<unsigned_char,_32UL>::TryResizeForOverwrite
          (InplaceVector<unsigned_char,_32UL> *this,size_t new_size)

{
  if (new_size <= this->size_) {
    Shrink(this,new_size);
    return true;
  }
  if (0x20 < new_size) {
    return false;
  }
  this->size_ = (PackedSize<32UL>)new_size;
  return true;
}

Assistant:

[[nodiscard]] bool TryResizeForOverwrite(size_t new_size) {
    if (new_size <= size_) {
      Shrink(new_size);
      return true;
    }
    if (new_size > capacity()) {
      return false;
    }
    std::uninitialized_default_construct_n(data() + size_, new_size - size_);
    size_ = static_cast<PackedSize<N>>(new_size);
    return true;
  }